

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParseCharEncoding(void)

{
  int iVar1;
  xmlCharEncoding val;
  int iVar2;
  char *val_00;
  int local_24;
  int n_name;
  char *name;
  xmlCharEncoding ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = XML_CHAR_ENCODING_NONE;
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    val_00 = gen_const_char_ptr(local_24,0);
    val = xmlParseCharEncoding(val_00);
    desret_xmlCharEncoding(val);
    call_tests = call_tests + 1;
    des_const_char_ptr(local_24,val_00,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlParseCharEncoding",(ulong)(uint)(iVar2 - iVar1));
      ret_val = ret_val + XML_CHAR_ENCODING_UTF8;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParseCharEncoding(void) {
    int test_ret = 0;

    int mem_base;
    xmlCharEncoding ret_val;
    const char * name; /* the encoding name as parsed, in UTF-8 format (ASCII actually) */
    int n_name;

    for (n_name = 0;n_name < gen_nb_const_char_ptr;n_name++) {
        mem_base = xmlMemBlocks();
        name = gen_const_char_ptr(n_name, 0);

        ret_val = xmlParseCharEncoding(name);
        desret_xmlCharEncoding(ret_val);
        call_tests++;
        des_const_char_ptr(n_name, name, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParseCharEncoding",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_name);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}